

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)74,(moira::Mode)0,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **ppcVar1;
  Syntax SVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  
  SVar2 = str->style->syntax;
  ppcVar1 = &str->ptr;
  if (SVar2 - GNU < 2) {
    cVar4 = 'm';
    lVar6 = 0;
    do {
      pcVar5 = *ppcVar1;
      *ppcVar1 = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = "fdmove"[lVar6 + 3];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = *ppcVar1;
      *ppcVar1 = pcVar5 + 1;
    }
    *pcVar5 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar3 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar3);
      goto LAB_0023f4fa;
    }
  }
  else {
    if (SVar2 != MUSASHI) {
      cVar4 = 'm';
      lVar6 = 0;
      do {
        pcVar5 = *ppcVar1;
        *ppcVar1 = pcVar5 + 1;
        *pcVar5 = cVar4;
        cVar4 = "fdmove"[lVar6 + 3];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      pcVar5 = str->ptr;
      SVar2 = str->style->syntax;
      str->ptr = pcVar5 + 1;
      if (2 < SVar2 - MOIRA_MIT) {
        *pcVar5 = '.';
        pcVar5 = *ppcVar1;
        *ppcVar1 = pcVar5 + 1;
      }
      *pcVar5 = 'w';
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar5 = *ppcVar1;
        *ppcVar1 = pcVar5 + 1;
        *pcVar5 = ' ';
      }
      else {
        iVar3 = (str->tab).raw;
        pcVar5 = str->ptr;
        do {
          str->ptr = pcVar5 + 1;
          *pcVar5 = ' ';
          pcVar5 = str->ptr;
        } while (pcVar5 < str->base + iVar3);
      }
      goto LAB_0023f4fa;
    }
    cVar4 = 'm';
    lVar6 = 0;
    do {
      pcVar5 = *ppcVar1;
      *ppcVar1 = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = "fdmove"[lVar6 + 3];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar3 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar3);
      goto LAB_0023f4fa;
    }
  }
  pcVar5 = *ppcVar1;
  *ppcVar1 = pcVar5 + 1;
  *pcVar5 = ' ';
LAB_0023f4fa:
  StrWriter::operator<<(str,(Dn)(op & 7));
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar5 = *ppcVar1;
    *ppcVar1 = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str);
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = _____________xxx(op);

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, S>(src, addr) << Sep{} << Ccr{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
    }
}